

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_query.cpp
# Opt level: O2

unique_ptr<cmake,_std::default_delete<cmake>_> __thiscall
cmakels::cmake_query::instantiate_cmake(cmake_query *this,path *root_dir)

{
  cmake *this_00;
  bool bVar1;
  runtime_error *this_01;
  string local_60;
  path cmake_exe_in_build_tree;
  
  cmake_exe_in_build_tree._M_pathname._M_dataplus._M_p._0_4_ = 2;
  local_60._M_dataplus._M_p._0_4_ = 1;
  std::make_unique<cmake,cmake::Role,cmState::Mode>((Role *)this,(Mode *)&cmake_exe_in_build_tree);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&cmake_exe_in_build_tree,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             config::cmake_exe_path_abi_cxx11_,auto_format);
  bVar1 = std::filesystem::exists(&cmake_exe_in_build_tree);
  if (bVar1) {
    std::filesystem::__cxx11::path::string(&local_60,&cmake_exe_in_build_tree);
    cmSystemTools::FindCMakeResources
              ((char *)CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_));
    std::__cxx11::string::~string((string *)&local_60);
    this_00 = (cmake *)(this->root_dir_)._M_pathname._M_dataplus._M_p;
    std::filesystem::__cxx11::path::string(&local_60,root_dir);
    cmake::SetHomeDirectory(this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::filesystem::__cxx11::path::~path(&cmake_exe_in_build_tree);
    return (__uniq_ptr_data<cmake,_std::default_delete<cmake>,_true,_true>)
           (__uniq_ptr_data<cmake,_std::default_delete<cmake>,_true,_true>)this;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Couldn\'t find CMake resources.");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<cmake> instantiate_cmake(fs::path root_dir) {
  auto my_cmake = std::make_unique<cmake>(cmake::RoleProject, cmState::Project);

  // TODO the following is a hack for the weird global state that CMake needs
  // to initialize, probably we should avoid using FindCMakeResources and try
  // to initialize the relevant parts by hand
  fs::path cmake_exe_in_build_tree = config::cmake_exe_path;
  // TODO fix for install
  // fs::path cmake_exe_in_install_tree =
  //     cmakels_dir.parent_path().parent_path() / "bin/cmake.exe";

  // string().c_str() to convert path to const char* on win, see
  // https://stackoverflow.com/a/54109263/5085250
  if (fs::exists(cmake_exe_in_build_tree))
    cmSystemTools::FindCMakeResources(cmake_exe_in_build_tree.string().c_str());
  // else if (fs::exists(cmake_exe_in_install_tree))
  //   cmSystemTools::FindCMakeResources(cmake_exe_in_install_tree.string().c_str());
  else
    throw std::runtime_error("Couldn't find CMake resources.");

  my_cmake->SetHomeDirectory(root_dir.string());
  return my_cmake;
}